

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall kj::BufferedInputStreamWrapper::skip(BufferedInputStreamWrapper *this,size_t bytes)

{
  ulong uVar1;
  void *__buf;
  ssize_t sVar2;
  void *__nbytes;
  
  uVar1 = (this->bufferAvailable).size_;
  if (uVar1 < bytes) {
    __nbytes = (void *)(bytes - uVar1);
    __buf = (void *)(this->buffer).size_;
    if (__buf < __nbytes) {
      (this->bufferAvailable).ptr = (uchar *)0x0;
      (this->bufferAvailable).size_ = 0;
      (*this->inner->_vptr_InputStream[3])(this->inner,__nbytes);
      return;
    }
    sVar2 = InputStream::read(this->inner,(int)(this->buffer).ptr,__buf,(size_t)__nbytes);
    (this->bufferAvailable).ptr = (uchar *)((long)__nbytes + (long)(this->buffer).ptr);
    (this->bufferAvailable).size_ = sVar2 - (long)__nbytes;
  }
  else {
    (this->bufferAvailable).ptr = (this->bufferAvailable).ptr + bytes;
    (this->bufferAvailable).size_ = uVar1 - bytes;
  }
  return;
}

Assistant:

void BufferedInputStreamWrapper::skip(size_t bytes) {
  if (bytes <= bufferAvailable.size()) {
    bufferAvailable = bufferAvailable.slice(bytes, bufferAvailable.size());
  } else {
    bytes -= bufferAvailable.size();
    if (bytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer, bytes);
      bufferAvailable = buffer.slice(bytes, n);
    } else {
      // Forward large skip to the underlying stream.
      bufferAvailable = nullptr;
      inner.skip(bytes);
    }
  }
}